

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emulator.c
# Opt level: O2

void gb_write_ext_ram(Emulator *e,MaskedAddress addr,u8 value)

{
  if ((e->state).memory_map_state.ext_ram_enabled == FALSE) {
    HOOK_write_ram_disabled_ab(e,"gb_write_ext_ram",addr,value);
    return;
  }
  if (addr < 0x2000) {
    (e->state).ext_ram.data[(ulong)addr | (ulong)(e->state).memory_map_state.ext_ram_base] = value;
    (e->state).ext_ram_updated = TRUE;
    return;
  }
  __assert_fail("addr <= ADDR_MASK_8K",
                "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/src/emulator.c",
                0x4db,"void gb_write_ext_ram(Emulator *, MaskedAddress, u8)");
}

Assistant:

static void gb_write_ext_ram(Emulator* e, MaskedAddress addr, u8 value) {
  if (MMAP_STATE.ext_ram_enabled) {
    assert(addr <= ADDR_MASK_8K);
    EXT_RAM.data[MMAP_STATE.ext_ram_base | addr] = value;
    e->state.ext_ram_updated = TRUE;
  } else {
    HOOK(write_ram_disabled_ab, addr, value);
  }
}